

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

Mat * ncnn::Mat::from_float16(Mat *__return_storage_ptr__,unsigned_short *data,int size)

{
  Option opt;
  Mat local_a0;
  Option local_58;
  
  local_a0.refcount = (int *)0x0;
  local_a0.elemsize = 2;
  local_a0.elempack = 1;
  local_a0.allocator = (Allocator *)0x0;
  local_a0.dims = 1;
  local_a0.h = 1;
  local_a0.d = 1;
  local_a0.c = 1;
  local_a0.cstep = (size_t)size;
  __return_storage_ptr__->cstep = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->d = 0;
  __return_storage_ptr__->c = 0;
  local_a0.data = data;
  local_a0.w = size;
  Option::Option(&local_58);
  local_58.num_threads = 1;
  cast_float16_to_float32(&local_a0,__return_storage_ptr__,&local_58);
  if (local_a0.refcount != (int *)0x0) {
    LOCK();
    *local_a0.refcount = *local_a0.refcount + -1;
    UNLOCK();
    if (*local_a0.refcount == 0) {
      if (local_a0.allocator == (Allocator *)0x0) {
        if ((unsigned_short *)local_a0.data != (unsigned_short *)0x0) {
          free(local_a0.data);
        }
      }
      else {
        (*(local_a0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_float16(const unsigned short* data, int size)
{
    Mat src(size, (void*)data, (size_t)2u);
    Mat dst;

    Option opt;
    opt.num_threads = 1; // TODO
    cast_float16_to_float32(src, dst, opt);

    return dst;
}